

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

char * TxtReplace(char *in_str,char *in_substr,char *out_substr,int recurse)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  if (in_str == (char *)0x0) {
    in_str = (char *)0x0;
  }
  else {
    sVar2 = strlen(in_str);
    sVar3 = strlen(in_substr);
    iVar9 = (int)sVar2;
    iVar11 = (int)sVar3;
    if (iVar11 != 0 && iVar9 != 0) {
      sVar2 = strlen(out_substr);
      pcVar4 = strstr(in_str,in_substr);
      iVar10 = (int)sVar2;
      uVar1 = iVar10 - iVar11;
      if (uVar1 == 0 || iVar10 < iVar11) {
        if (pcVar4 != (char *)0x0) {
          sVar2 = (size_t)iVar10;
          do {
            if (iVar10 != 0) {
              memcpy(pcVar4,out_substr,sVar2);
            }
            if (iVar10 != iVar11) {
              pcVar5 = pcVar4 + sVar2;
              cVar7 = pcVar4[iVar11];
              if (cVar7 != '\0') {
                pcVar6 = pcVar4 + (long)iVar11 + 1;
                do {
                  *pcVar5 = cVar7;
                  pcVar5 = pcVar5 + 1;
                  cVar7 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while (cVar7 != '\0');
              }
              *pcVar5 = cVar7;
            }
            pcVar4 = pcVar4 + sVar2;
            if (recurse != 0) {
              pcVar4 = in_str;
            }
            pcVar4 = strstr(pcVar4,in_substr);
          } while (pcVar4 != (char *)0x0);
        }
      }
      else {
        if (pcVar4 == (char *)0x0) {
          iVar12 = 0;
        }
        else {
          iVar12 = 0;
          do {
            iVar12 = iVar12 + 1;
            pcVar4 = strstr(pcVar4 + iVar11,in_substr);
          } while (pcVar4 != (char *)0x0);
        }
        if (iVar12 != 0) {
          pcVar4 = (char *)realloc(in_str,(long)(int)(iVar12 * uVar1 + iVar9 + 1));
          pcVar5 = strstr(pcVar4,in_substr);
          bVar14 = pcVar5 != (char *)0x0;
          if (bVar14) {
            uVar13 = (ulong)uVar1;
            lVar8 = (long)iVar9;
            do {
              for (pcVar6 = pcVar4 + lVar8; pcVar6 != pcVar5 + ((long)iVar11 - uVar13);
                  pcVar6 = pcVar6 + -1) {
                pcVar6[uVar13] = *pcVar6;
              }
              memcpy(pcVar5,out_substr,(long)iVar10);
              pcVar5 = pcVar5 + iVar10;
              if (recurse != 0) {
                pcVar5 = in_str;
              }
              pcVar5 = strstr(pcVar5,in_substr);
              bVar14 = pcVar5 != (char *)0x0;
              if (pcVar5 == (char *)0x0) break;
              lVar8 = lVar8 + uVar13;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          in_str = pcVar4;
          if (bVar14) {
            printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can\'t use this one!\n"
                   ,in_substr,out_substr);
            exit(7);
          }
        }
      }
    }
  }
  return in_str;
}

Assistant:

char *TxtReplace(char *in_str, char *in_substr, char *out_substr, int recurse)
{
	#undef FUNC
	#define FUNC "TxtReplace"
	
	char *str_look,*m1,*m2;
	char *out_str;
	int sl,l1,l2,dif,cpt;

	if (in_str==NULL)
		return NULL;
		
	sl=strlen(in_str);
	l1=strlen(in_substr);
	/* empty string, nothing to do except return empty string */
	if (!sl || !l1)
		return in_str;
		
	l2=strlen(out_substr);
	dif=l2-l1;
		
	/* replace string is small or equal in size, we dont realloc */
	if (dif<=0)
	{
		/* we loop while there is a replace to do */
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			/*logdebug(str_look);*/
			
			/* we copy the new string if his len is not null */
			if (l2)
				memcpy(str_look,out_substr,l2);
			/* only if len are different */
			if (l1!=l2)
			{
				/* we move the end of the string byte per byte
				   because memory locations overlap. This is
				   faster than memmove */
				m1=str_look+l1;
				m2=str_look+l2;
				while (*m1!=0)
				{
					*m2=*m1;
					m1++;m2++;
				}
				/* we must copy the EOL */
				*m2=*m1;
			}
			/* look for next replace */
			if (!recurse)
				str_look=strstr(str_look+l2,in_substr);
			else
				str_look=strstr(in_str,in_substr);
		}
		out_str=in_str;
	}
	else
	{
		/* we need to count each replace */
		cpt=0;
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			cpt++;
			str_look=strstr(str_look+l1,in_substr);
		}
		/* is there anything to do? */
		if (cpt)
		{
			/* we realloc to a size that will fit all replaces */
			out_str=MemRealloc(in_str,sl+1+dif*cpt);
			str_look=strstr(out_str,in_substr);
			while (str_look!=NULL && cpt)
			{
				/* as the replace string is bigger we
				   have to move memory first from the end */
				m1=out_str+sl;
				m2=m1+dif;
				sl+=dif;
				while (m1!=str_look+l1-dif)
				{
					*m2=*m1;
					m1--;m2--;
				}
				/* then we copy the replace string (can't be NULL in this case) */
				memcpy(str_look,out_substr,l2);
				
				/* look for next replace */
				if (!recurse)
					str_look=strstr(str_look+l2,in_substr);
				else
					str_look=strstr(in_str,in_substr);
					
				/* to prevent from naughty overlap */
				cpt--;
			}
			if (str_look!=NULL)
			{
				printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can't use this one!\n",in_substr,out_substr);
				exit(ABORT_ERROR);
			}
		}
		else
			out_str=in_str;
	}
	return out_str;
}